

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pla.h
# Opt level: O2

Pla_Man_t * Pla_ManAlloc(char *pFileName,int nIns,int nOuts,int nCubes)

{
  Pla_Man_t *pPVar1;
  char *pcVar2;
  size_t sVar3;
  undefined4 extraout_EDX;
  undefined4 extraout_EDX_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  pPVar1 = (Pla_Man_t *)calloc(1,0x98);
  pcVar2 = Extra_FileDesignName(pFileName);
  pPVar1->pName = pcVar2;
  if (pFileName == (char *)0x0) {
    pcVar2 = (char *)0x0;
  }
  else {
    sVar3 = strlen(pFileName);
    pcVar2 = (char *)malloc(sVar3 + 1);
    strcpy(pcVar2,pFileName);
  }
  pPVar1->pSpec = pcVar2;
  pPVar1->nIns = nIns;
  pPVar1->nOuts = nOuts;
  pPVar1->nInWords = ((nIns >> 5) - (uint)((nIns & 0x1fU) == 0)) + 1;
  pPVar1->nOutWords = ((nOuts >> 5) - (uint)((nOuts & 0x1fU) == 0)) + 1;
  Vec_IntFillNatural(&pPVar1->vCubes,nCubes);
  Vec_WrdFill(&pPVar1->vInBits,pPVar1->nInWords * (pPVar1->vCubes).nSize,
              CONCAT44(extraout_var,extraout_EDX));
  Vec_WrdFill(&pPVar1->vOutBits,pPVar1->nOutWords * (pPVar1->vCubes).nSize,
              CONCAT44(extraout_var_00,extraout_EDX_00));
  return pPVar1;
}

Assistant:

static inline Pla_Man_t * Pla_ManAlloc( char * pFileName, int nIns, int nOuts, int nCubes )
{
    Pla_Man_t * p = ABC_CALLOC( Pla_Man_t, 1 );
    p->pName = Extra_FileDesignName( pFileName );
    p->pSpec = Abc_UtilStrsav( pFileName );
    p->nIns  = nIns;
    p->nOuts = nOuts;
    p->nInWords  = Abc_Bit6WordNum( 2*nIns );
    p->nOutWords = Abc_Bit6WordNum( 2*nOuts );
    Vec_IntFillNatural( &p->vCubes, nCubes );
    Vec_WrdFill( &p->vInBits,  Pla_ManCubeNum(p) * p->nInWords,  0 );
    Vec_WrdFill( &p->vOutBits, Pla_ManCubeNum(p) * p->nOutWords, 0 );
    return p;
}